

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall jsonnet::internal::anon_unknown_0::Stack::~Stack(Stack *this)

{
  undefined8 *in_RDI;
  vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
  *in_stack_00000010;
  
  *in_RDI = &PTR_dump_00468418;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
  ::~vector(in_stack_00000010);
  return;
}

Assistant:

~Stack(void) {}